

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::InnerProductParameter::SerializeWithCachedSizes
          (InnerProductParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  uint32 value;
  int32 value_00;
  UnknownFieldSet *unknown_fields;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  InnerProductParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    value = num_output(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,value,output);
  }
  if ((uVar1 & 0x10) != 0) {
    bVar2 = bias_term(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar2,output);
  }
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (3,(MessageLite *)this->weight_filler_,output);
  }
  if ((uVar1 & 2) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (4,(MessageLite *)this->bias_filler_,output);
  }
  if ((uVar1 & 0x20) != 0) {
    value_00 = axis(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(5,value_00,output);
  }
  if ((uVar1 & 8) != 0) {
    bVar2 = transpose(this);
    google::protobuf::internal::WireFormatLite::WriteBool(6,bVar2,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = InnerProductParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void InnerProductParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.InnerProductParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional uint32 num_output = 1;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->num_output(), output);
  }

  // optional bool bias_term = 2 [default = true];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->bias_term(), output);
  }

  // optional .caffe.FillerParameter weight_filler = 3;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, *this->weight_filler_, output);
  }

  // optional .caffe.FillerParameter bias_filler = 4;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, *this->bias_filler_, output);
  }

  // optional int32 axis = 5 [default = 1];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(5, this->axis(), output);
  }

  // optional bool transpose = 6 [default = false];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->transpose(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.InnerProductParameter)
}